

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

CppType __thiscall google::protobuf::MapValueRef::type(MapValueRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  CVar1 = this->type_;
  if ((CVar1 == 0) || (this->data_ == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x2a0);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"MapValueRef::type MapValueRef is not initialized.");
    internal::LogFinisher::operator=(&local_49,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
    CVar1 = this->type_;
  }
  return CVar1;
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == 0 || data_ == NULL) {
      GOOGLE_LOG(FATAL) << "Protocol Buffer map usage error:\n"
                 << "MapValueRef::type MapValueRef is not initialized.";
    }
    return (FieldDescriptor::CppType)type_;
  }